

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O2

int ftp_open_network(char *filename,FILE **ftpfile,FILE **command,int *sock)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  FILE *pFVar6;
  FILE **ppFVar7;
  char *pcVar8;
  bool bVar9;
  float fVar10;
  int port;
  FILE **local_14e0;
  float version;
  FILE **local_14d0;
  char *local_14c8;
  int tmpint;
  char ip [100];
  char host [100];
  char agentStr [100];
  char proto [100];
  char tmpstr [1200];
  char recbuf [1200];
  char fn [1200];
  char turl [1200];
  
  version = 0.0;
  sVar4 = strlen(filename);
  if (sVar4 < 0x4aa) {
    builtin_strncpy(turl,"ftp://",7);
    strcat(turl,filename);
    pcVar8 = host;
    iVar1 = NET_ParseUrl(turl,proto,pcVar8,&port,fn);
    if (iVar1 == 0) {
      port = 0x15;
      fVar10 = ffvers(&version);
      snprintf(agentStr,100,"User-Agent: FITSIO/HEASARC/%-8.4f",(double)fVar10);
      pcVar5 = strrchr(pcVar8,0x40);
      local_14e0 = (FILE **)agentStr;
      local_14d0 = ftpfile;
      if (pcVar5 == (char *)0x0) {
        local_14c8 = "anonymous";
      }
      else {
        *pcVar5 = '\0';
        pcVar8 = pcVar5 + 1;
        local_14c8 = host;
        pcVar5 = strchr(local_14c8,0x3a);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
          local_14e0 = (FILE **)(pcVar5 + 1);
        }
      }
      iVar1 = 10;
      while (bVar9 = iVar1 != 0, iVar1 = iVar1 + -1, bVar9) {
        iVar2 = NET_TcpConnect(pcVar8,port);
        *sock = iVar2;
        pFVar6 = fdopen(iVar2,"r");
        *command = (FILE *)pFVar6;
        if (pFVar6 == (FILE *)0x0) {
          pcVar8 = "fdopen failed to convert socket to stdio file (ftp_open_netowrk)";
          goto LAB_001357de;
        }
        ppFVar7 = command;
        iVar2 = ftp_status((FILE *)pFVar6,"220 ");
        iVar3 = (int)ppFVar7;
        if (iVar2 == 0) {
          pcVar8 = local_14c8;
          snprintf(tmpstr,0x4b0,"USER %s\r\n");
          iVar2 = (int)pcVar8;
          iVar1 = *sock;
          sVar4 = strlen(tmpstr);
          NET_SendRaw(iVar1,tmpstr,(int)sVar4,iVar2);
          iVar1 = ftp_status(*command,"331 ");
          if (iVar1 == 0) {
            ppFVar7 = local_14e0;
            snprintf(tmpstr,0x4b0,"PASS %s\r\n");
            iVar1 = *sock;
            sVar4 = strlen(tmpstr);
            NET_SendRaw(iVar1,tmpstr,(int)sVar4,(int)ppFVar7);
            iVar1 = ftp_status(*command,"230 ");
            iVar2 = (int)ppFVar7;
            if (iVar1 != 0) {
              pcVar8 = "PASS error, no 230 seen (ftp_open_network)";
              goto LAB_001359d3;
            }
            pcVar8 = fn;
            pcVar5 = strrchr(pcVar8,0x2f);
            if (pcVar5 == (char *)0x0) {
              builtin_strncpy(tmpstr,"CWD /\r\n",8);
            }
            else {
              *pcVar5 = '\0';
              pcVar8 = pcVar5 + 1;
              ppFVar7 = (FILE **)(ulong)(byte)fn[0];
              if (fn[0] == '/') {
                ppFVar7 = (FILE **)(fn + 1);
              }
              else {
                if (fn[0] == '\0') {
                  builtin_strncpy(tmpstr,"CWD /\r\n",8);
                  goto LAB_00135a86;
                }
                ppFVar7 = (FILE **)fn;
              }
              snprintf(tmpstr,0x4b0,"CWD %s\r\n");
            }
LAB_00135a86:
            iVar1 = *sock;
            sVar4 = strlen(tmpstr);
            NET_SendRaw(iVar1,tmpstr,(int)sVar4,(int)ppFVar7);
            iVar1 = ftp_status(*command,"250 ");
            iVar2 = (int)ppFVar7;
            if (iVar1 == 0) {
              if (*pcVar8 == '\0') {
                pcVar8 = "Null file name (ftp_open)";
                goto LAB_00135b30;
              }
              builtin_strncpy(tmpstr,"TYPE I\r\n",9);
              iVar1 = *sock;
              sVar4 = strlen(tmpstr);
              NET_SendRaw(iVar1,tmpstr,(int)sVar4,(int)ppFVar7);
              iVar1 = ftp_status(*command,"200 ");
              iVar2 = (int)ppFVar7;
              if (iVar1 != 0) {
                pcVar8 = "TYPE I error, 200 not seen (ftp_open_network)";
                goto LAB_00135ac4;
              }
              NET_SendRaw(*sock,"PASV\r\n",6,iVar2);
              pcVar5 = fgets(recbuf,0x4b0,(FILE *)*command);
              iVar2 = (int)ppFVar7;
              if (pcVar5 == (char *)0x0) {
                pcVar8 = "PASV error (ftp_open)";
LAB_00135b30:
                iVar2 = (int)ppFVar7;
                ffpmsg(pcVar8);
              }
              else if (((recbuf[0] == '2') && (recbuf[1] == '2')) && (recbuf[2] == '7')) {
                pcVar5 = strchr(recbuf,0x28);
                if (pcVar5 != (char *)0x0) {
                  ppFVar7 = (FILE **)0x0;
                  *pcVar5 = '\0';
                  ip[0] = '\0';
                  pcVar5 = strtok(pcVar5 + 1,",)");
                  if (pcVar5 != (char *)0x0) {
                    strcpy(ip,pcVar5);
                    sVar4 = strlen(ip);
                    (ip + sVar4)[0] = '.';
                    (ip + sVar4)[1] = '\0';
                    pcVar5 = strtok((char *)0x0,",)");
                    if (pcVar5 != (char *)0x0) {
                      strcat(ip,pcVar5);
                      sVar4 = strlen(ip);
                      (ip + sVar4)[0] = '.';
                      (ip + sVar4)[1] = '\0';
                      pcVar5 = strtok((char *)0x0,",)");
                      if (pcVar5 != (char *)0x0) {
                        strcat(ip,pcVar5);
                        sVar4 = strlen(ip);
                        (ip + sVar4)[0] = '.';
                        (ip + sVar4)[1] = '\0';
                        pcVar5 = strtok((char *)0x0,",)");
                        if (pcVar5 != (char *)0x0) {
                          strcat(ip,pcVar5);
                          pcVar5 = strtok((char *)0x0,",)");
                          if (pcVar5 != (char *)0x0) {
                            __isoc99_sscanf(pcVar5,"%d",&port);
                            port = port << 8;
                            pcVar5 = strtok((char *)0x0,",)");
                            if (pcVar5 != (char *)0x0) {
                              __isoc99_sscanf(pcVar5,"%d",&tmpint);
                              port = port + tmpint;
                              if (*pcVar8 == '\0') {
                                pcVar8 = "Null file name (ftp_open_network)";
                              }
                              else {
                                iVar1 = NET_TcpConnect(ip,port);
                                pFVar6 = fdopen(iVar1,"r");
                                *local_14d0 = (FILE *)pFVar6;
                                if (pFVar6 != (FILE *)0x0) {
                                  snprintf(tmpstr,0x4b0,"RETR %s\r\n");
                                  iVar2 = (int)pcVar8;
                                  iVar3 = *sock;
                                  sVar4 = strlen(tmpstr);
                                  NET_SendRaw(iVar3,tmpstr,(int)sVar4,iVar2);
                                  iVar3 = ftp_status(*command,"150 ");
                                  if (iVar3 == 0) {
                                    return 0;
                                  }
                                  fclose((FILE *)*local_14d0);
                                  NET_SendRaw(iVar1,"QUIT\r\n",6,iVar2);
                                  fclose((FILE *)*command);
                                  iVar1 = *sock;
                                  goto LAB_001359ed;
                                }
                                pcVar8 = "Could not connect to passive port (ftp_open_network)";
                                ppFVar7 = local_14d0;
                              }
                              goto LAB_00135b30;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                pcVar8 = "PASV error (ftp_open_network)";
                goto LAB_00135b30;
              }
              pFVar6 = (FILE *)*command;
            }
            else {
              pcVar8 = "CWD error, no 250 seen (ftp_open_network)";
LAB_00135ac4:
              ffpmsg(pcVar8);
              pFVar6 = (FILE *)*command;
            }
          }
          else {
            pcVar8 = "USER error no 331 seen (ftp_open_network)";
LAB_001359d3:
            ffpmsg(pcVar8);
            pFVar6 = (FILE *)*command;
          }
          fclose(pFVar6);
          iVar1 = *sock;
LAB_001359ed:
          NET_SendRaw(iVar1,"QUIT\r\n",6,iVar2);
          return 0x68;
        }
        fclose((FILE *)*command);
        NET_SendRaw(*sock,"QUIT\r\n",6,iVar3);
        sleep(5);
      }
      pcVar8 = "error connecting to remote server, no 220 seen (ftp_open_network)";
    }
    else {
      pcVar8 = recbuf;
      snprintf(pcVar8,0x4b0,"URL Parse Error (ftp_open) %s",filename);
    }
  }
  else {
    pcVar8 = "ftp filename is too long (ftp_open_network)";
  }
LAB_001357de:
  ffpmsg(pcVar8);
  return 0x68;
}

Assistant:

static int ftp_open_network(char *filename, FILE **ftpfile, FILE **command, int *sock)
{
  int status;
  int sock1;
  int tmpint;
  char recbuf[MAXLEN];
  char errorstr[MAXLEN];
  char tmpstr[MAXLEN];
  char proto[SHORTLEN];
  char host[SHORTLEN];
  char agentStr[SHORTLEN];
  char *newhost;
  char *username;
  char *password;
  char fn[MAXLEN];
  char *newfn;
  char *passive;
  char *tstr;
  char *saveptr;
  char ip[SHORTLEN];
  char turl[MAXLEN];
  int port;
  int ii,tryingtologin = 1;
  float version=0.0;

  /* parse the URL */
  if (strlen(filename) > MAXLEN - 7) {
    ffpmsg("ftp filename is too long (ftp_open_network)");
    return (FILE_NOT_OPENED);
  }

  strcpy(turl,"ftp://");
  strcat(turl,filename);
  if (NET_ParseUrl(turl,proto,host,&port,fn)) {
    snprintf(errorstr,MAXLEN,"URL Parse Error (ftp_open) %s",filename);
    ffpmsg(errorstr);
    return (FILE_NOT_OPENED);
  }
  
  port = 21;
  /* We might have a user name.  If not, set defaults for username and password */
  username = "anonymous";
  snprintf(agentStr,SHORTLEN,"User-Agent: FITSIO/HEASARC/%-8.4f",ffvers(&version));
  password = agentStr;
  /* is there an @ sign */
  if (NULL != (newhost = strrchr(host,'@'))) {
    *newhost = '\0'; /* make it a null, */
    newhost++; /* Now newhost points to the host name and host points to the 
		  user name, password combo */
    username = host;
    /* is there a : for a password */
    if (NULL != strchr(username,':')) {
      password = strchr(username,':');
      *password = '\0';
      password++;
    }
  } else {
    newhost = host;
  }

  for (ii = 0; ii < 10; ii++) {  /* make up to 10 attempts to log in */
  
    /* Connect to the host on the required port */
    *sock = NET_TcpConnect(newhost,port);
    /* convert it to a stdio file */
    if (NULL == (*command = fdopen(*sock,"r"))) {
      ffpmsg ("fdopen failed to convert socket to stdio file (ftp_open_netowrk)");
      return (FILE_NOT_OPENED);
    }

    /* Wait for the 220 response */
    if (ftp_status(*command,"220 ")) {
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);

/*      ffpmsg("sleeping for 5 in ftp_open_network, then try again"); */

      sleep (5);  /* take a nap and hope ftp server sorts itself out in the meantime */

    } else {
      tryingtologin = 0;
      break;
    }
  }

  if (tryingtologin) { /* the 10 attempts were not successful */
     ffpmsg ("error connecting to remote server, no 220 seen (ftp_open_network)");
     return (FILE_NOT_OPENED);
  }

  /* Send the user name and wait for the right response */
  snprintf(tmpstr,MAXLEN,"USER %s\r\n",username);

  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);

  if (ftp_status(*command,"331 ")) {
    ffpmsg ("USER error no 331 seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
  
  /* Send the password and wait for the right response */
  snprintf(tmpstr,MAXLEN,"PASS %s\r\n",password);
  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(*command,"230 ")) {
    ffpmsg ("PASS error, no 230 seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }

  /* now do the cwd command */
  newfn = strrchr(fn,'/');
  if (newfn == NULL) {
    strcpy(tmpstr,"CWD /\r\n");
    newfn = fn;
  } else {
    *newfn = '\0';
    newfn++;
    if (strlen(fn) == 0) {
      strcpy(tmpstr,"CWD /\r\n");
    } else {
      /* remove the leading slash */
      if (fn[0] == '/') {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",&fn[1]);
      } else {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",fn);
      } 
    }
  }
  
  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(*command,"250 ")) {
    ffpmsg ("CWD error, no 250 seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
  
  if (!strlen(newfn)) {
    ffpmsg("Null file name (ftp_open)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }

  /* Always use binary mode */
  snprintf(tmpstr,MAXLEN,"TYPE I\r\n");
  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(*command,"200 ")) {
    ffpmsg ("TYPE I error, 200 not seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
 
  status = NET_SendRaw(*sock,"PASV\r\n",6,NET_DEFAULT);

  if (!(fgets(recbuf,MAXLEN,*command))) {
    ffpmsg ("PASV error (ftp_open)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
  
  /*  Passive mode response looks like
      227 Entering Passive Mode (129,194,67,8,210,80) */
  if (recbuf[0] == '2' && recbuf[1] == '2' && recbuf[2] == '7') {
    /* got a good passive mode response, find the opening ( */
    
    if (!(passive = strchr(recbuf,'('))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    
    *passive = '\0';
    passive++;
    ip[0] = '\0';
      
    /* Messy parsing of response from PASV *command */
    
    if (!(tstr = ffstrtok(passive,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcpy(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcat(ip,tstr);
    
    /* Done the ip number, now do the port # */
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    sscanf(tstr,"%d",&port);
    port *= 256;
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    sscanf(tstr,"%d",&tmpint);
    port += tmpint;

    if (!strlen(newfn)) {
      ffpmsg("Null file name (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    
    /* Connect to the data port */
    sock1 = NET_TcpConnect(ip,port);
    if (NULL == (*ftpfile = fdopen(sock1,"r"))) {
      ffpmsg ("Could not connect to passive port (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }

    /* Send the retrieve command */
    snprintf(tmpstr,MAXLEN,"RETR %s\r\n",newfn);
    status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);

    if (ftp_status(*command,"150 ")) {
      fclose(*ftpfile);
      NET_SendRaw(sock1,"QUIT\r\n",6,NET_DEFAULT);
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    return 0;    /* successfully opened the ftp file */
  }
  
  /* no passive mode */

  fclose(*command);
  NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
  return (FILE_NOT_OPENED);
}